

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RecordErrorByteOffset(sqlite3 *db,char *z)

{
  char *__s;
  size_t sVar1;
  char *zEnd;
  char *zText;
  Parse *pParse;
  char *z_local;
  sqlite3 *db_local;
  
  if ((((db != (sqlite3 *)0x0) && (db->errByteOffset == -2)) && (db->pParse != (Parse *)0x0)) &&
     (__s = db->pParse->zTail, __s != (char *)0x0)) {
    sVar1 = strlen(__s);
    if ((__s <= z) && (z < __s + sVar1)) {
      db->errByteOffset = (int)z - (int)__s;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RecordErrorByteOffset(sqlite3 *db, const char *z){
  const Parse *pParse;
  const char *zText;
  const char *zEnd;
  assert( z!=0 );
  if( NEVER(db==0) ) return;
  if( db->errByteOffset!=(-2) ) return;
  pParse = db->pParse;
  if( NEVER(pParse==0) ) return;
  zText =pParse->zTail;
  if( NEVER(zText==0) ) return;
  zEnd = &zText[strlen(zText)];
  if( SQLITE_WITHIN(z,zText,zEnd) ){
    db->errByteOffset = (int)(z-zText);
  }
}